

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::crn_unpacker::unpack_dxt1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  block_buffer_element *pbVar6;
  uint *puVar7;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  vector<crnd::crn_unpacker::block_buffer_element> *in_RDI;
  uint in_R8D;
  uint32 color_selector_index;
  uint8 endpoint_reference;
  block_buffer_element *buffer;
  uint32 x;
  bool visible;
  uint32 y;
  uint32 *pData;
  uint32 f;
  uint8 reference_group;
  uint32 color_endpoint_index;
  int32 delta_pitch_in_dwords;
  uint32 height;
  uint32 width;
  uint32 num_color_endpoints;
  bool local_6d;
  uint32 in_stack_ffffffffffffff94;
  uint uVar8;
  byte local_59;
  uint local_4c;
  uint local_44;
  uint *local_40;
  uint local_38;
  byte local_31;
  uint32 local_30;
  
  uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)&in_RDI[0xb].m_size);
  uVar3 = in_ECX + 1 & 0xfffffffe;
  uVar4 = vector<crnd::crn_unpacker::block_buffer_element>::size
                    ((vector<crnd::crn_unpacker::block_buffer_element> *)&in_RDI[0xf].m_size);
  if (uVar4 < uVar3) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(in_RDI,in_stack_ffffffffffffff94);
  }
  local_30 = 0;
  local_31 = 0;
  local_38 = 0;
  while (uVar8 = local_38,
        uVar5 = crn_packed_uint::operator_cast_to_unsigned_int
                          ((crn_packed_uint *)((long)&in_RDI[1].m_p[2].endpoint_reference + 1)),
        uVar8 < uVar5) {
    local_40 = *(uint **)(in_RSI + (ulong)local_38 * 8);
    for (local_44 = 0; local_44 < (in_R8D + 1 & 0xfffffffe); local_44 = local_44 + 1) {
      bVar1 = local_44 < in_R8D;
      for (local_4c = 0; local_4c < uVar3; local_4c = local_4c + 1) {
        local_6d = bVar1 && local_4c < in_ECX;
        if (((local_44 & 1) == 0) && ((local_4c & 1) == 0)) {
          uVar4 = symbol_codec::decode
                            ((symbol_codec *)&in_RDI[1].m_size,
                             (static_huffman_data_model *)(in_RDI + 3));
          local_31 = (byte)uVar4;
        }
        pbVar6 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                           ((vector<crnd::crn_unpacker::block_buffer_element> *)&in_RDI[0xf].m_size,
                            local_4c);
        if ((local_44 & 1) == 0) {
          local_59 = local_31 & 3;
          pbVar6->endpoint_reference = (byte)((int)(uint)local_31 >> 2) & 3;
          local_31 = (byte)((int)(uint)local_31 >> 4);
        }
        else {
          local_59 = (byte)pbVar6->endpoint_reference;
        }
        if (local_59 == 0) {
          uVar4 = symbol_codec::decode
                            ((symbol_codec *)&in_RDI[1].m_size,
                             (static_huffman_data_model *)&in_RDI[4].m_alloc_failed);
          local_30 = uVar4 + local_30;
          if (uVar2 <= local_30) {
            local_30 = local_30 - uVar2;
          }
          pbVar6->color_endpoint_index = (uint16)local_30;
        }
        else if (local_59 == 1) {
          pbVar6->color_endpoint_index = (uint16)local_30;
        }
        else {
          local_30 = (uint32)pbVar6->color_endpoint_index;
        }
        uVar4 = symbol_codec::decode
                          ((symbol_codec *)&in_RDI[1].m_size,
                           (static_huffman_data_model *)(in_RDI + 8));
        if (bVar1 && local_4c < in_ECX) {
          puVar7 = vector<unsigned_int>::operator[]
                             ((vector<unsigned_int> *)&in_RDI[0xb].m_size,local_30);
          *local_40 = *puVar7;
          puVar7 = vector<unsigned_int>::operator[]
                             ((vector<unsigned_int> *)&in_RDI[0xc].m_size,uVar4);
          local_40[1] = *puVar7;
        }
        local_40 = local_40 + 2;
        bVar1 = local_6d;
      }
      local_40 = local_40 + (int)((in_EDX >> 2) + uVar3 * -2);
    }
    local_38 = local_38 + 1;
  }
  return true;
}

Assistant:

bool unpack_dxt1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_color_endpoints = m_color_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

    if (m_block_buffer.size() < width)
      m_block_buffer.resize(width);

    uint32 color_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 2) {
          visible = visible && x < output_width;
          if (!(y & 1) && !(x & 1))
            reference_group = m_codec.decode(m_reference_encoding_dm);
          block_buffer_element &buffer = m_block_buffer[x];
          uint8 endpoint_reference;
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            endpoint_reference = reference_group & 3;
            reference_group >>= 2;
            buffer.endpoint_reference = reference_group & 3;
            reference_group >>= 2;
          }
          if (!endpoint_reference) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
            buffer.color_endpoint_index = color_endpoint_index;
          } else if (endpoint_reference == 1) {
            buffer.color_endpoint_index = color_endpoint_index;
          } else {
            color_endpoint_index = buffer.color_endpoint_index;
          }
          uint32 color_selector_index = m_codec.decode(m_selector_delta_dm[0]);
          if (visible) {
            pData[0] = m_color_endpoints[color_endpoint_index];
            pData[1] = m_color_selectors[color_selector_index];
          }
        }
      }
    }
    return true;
  }